

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O1

region * __thiscall
toml::detail::character::scan(region *__return_storage_ptr__,character *this,location *loc)

{
  element_type *peVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  location first;
  location local_58;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((loc->location_ <
       (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - lVar2)) &&
     (*(char_type *)(lVar2 + loc->location_) == this->value_)) {
    location::location(&local_58,loc);
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar4 = loc->location_;
    lVar2 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar2;
    if (uVar4 + 1 < uVar5) {
      if (*(char *)(lVar2 + uVar4) == '\n') {
        loc->line_number_ = loc->line_number_ + 1;
        sVar3 = 1;
      }
      else {
        sVar3 = loc->column_number_ + 1;
      }
      loc->column_number_ = sVar3;
      uVar5 = uVar4 + 1;
    }
    else if (uVar5 != uVar4) {
      sVar3 = loc->line_number_;
      sVar6 = loc->column_number_;
      do {
        if (*(char *)(lVar2 + uVar4) == '\n') {
          sVar3 = sVar3 + 1;
          loc->line_number_ = sVar3;
          sVar6 = 1;
        }
        else {
          sVar6 = sVar6 + 1;
        }
        loc->column_number_ = sVar6;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    loc->location_ = uVar5;
    (__return_storage_ptr__->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (__return_storage_ptr__->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_58.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_58.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58.source_.
         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_58.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (__return_storage_ptr__->source_name_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->source_name_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->source_name_,
               local_58.source_name_._M_dataplus._M_p,
               local_58.source_name_._M_dataplus._M_p + local_58.source_name_._M_string_length);
    __return_storage_ptr__->first_ = local_58.location_;
    __return_storage_ptr__->first_line_ = local_58.line_number_;
    __return_storage_ptr__->first_column_ = local_58.column_number_;
    sVar3 = loc->location_;
    sVar6 = loc->line_number_;
    __return_storage_ptr__->length_ = sVar3 - local_58.location_;
    __return_storage_ptr__->last_ = sVar3;
    __return_storage_ptr__->last_line_ = sVar6;
    __return_storage_ptr__->last_column_ = loc->column_number_;
    location::~location(&local_58);
  }
  else {
    region::region(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE region character::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    if(loc.current() == this->value_)
    {
        const auto first = loc;
        loc.advance(1);
        return region(first, loc);
    }
    return region{};
}